

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intra_mode_search_utils.h
# Opt level: O1

void compute_gradient_info_sb(MACROBLOCK *x,BLOCK_SIZE sb_size,PLANE_TYPE plane)

{
  long lVar1;
  long lVar2;
  long lVar3;
  ushort *puVar4;
  PixelLevelGradientInfo *pPVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  int8_t iVar9;
  int iVar10;
  undefined7 in_register_00000011;
  long *plVar11;
  long lVar12;
  ushort *puVar13;
  uint uVar14;
  uint uVar15;
  int iVar16;
  uint uVar17;
  undefined7 in_register_00000031;
  int iVar18;
  uint uVar19;
  int iVar20;
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  long lVar24;
  long lVar25;
  uint uVar26;
  long lVar27;
  int *piVar28;
  ulong local_50;
  PixelLevelGradientInfo *grad_info_sb;
  
  iVar7 = (int)CONCAT71(in_register_00000011,plane);
  uVar23 = CONCAT71(in_register_00000011,plane) & 0xffffffff;
  uVar26 = iVar7 << 0x10;
  uVar22 = CONCAT71(in_register_00000031,sb_size) & 0xffffffff;
  uVar14 = (uint)(block_size_high[uVar22] >> ((byte)(x->e_mbd).plane[uVar23].subsampling_y & 0x1f));
  lVar24 = (ulong)(uint)(iVar7 << 7) + uVar23 * 8;
  plVar11 = (long *)((long)&x->plane[0].src.buf + lVar24);
  iVar7 = *(int *)((long)&x->plane[0].src.stride + lVar24);
  lVar24 = (long)iVar7;
  pPVar5 = x->pixel_gradient_info;
  if ((((x->e_mbd).cur_buf)->flags & 8) == 0) {
    if (2 < uVar14) {
      uVar15 = (uint)(block_size_wide[uVar22] >>
                     ((byte)(x->e_mbd).plane[uVar23].subsampling_x & 0x1f));
      local_50 = 1;
      lVar25 = *plVar11;
      do {
        lVar1 = lVar25 + lVar24;
        if (2 < uVar15) {
          lVar27 = lVar25 + lVar24 + -1;
          lVar8 = local_50 * uVar15;
          lVar2 = lVar1 + lVar24;
          uVar23 = (ulong)uVar26;
          uVar22 = 1;
          do {
            lVar3 = lVar27 + uVar22;
            lVar12 = lVar1 + uVar22 + 1;
            iVar16 = (uint)*(byte *)(lVar24 + lVar12) +
                     (uint)*(byte *)(-lVar24 + lVar12) + (uint)*(byte *)(lVar1 + 1 + uVar22) * 2;
            iVar18 = (uint)*(byte *)(lVar24 + lVar3) +
                     (uint)*(byte *)(-lVar24 + lVar3) + (uint)*(byte *)(lVar27 + uVar22) * 2;
            iVar7 = (((uint)*(byte *)(lVar2 + 1 + uVar22) + (uint)*(byte *)(lVar2 + -1 + uVar22)) -
                    ((uint)*(byte *)(lVar25 + 1 + uVar22) + (uint)*(byte *)(lVar25 + -1 + uVar22)))
                    + ((uint)*(byte *)(lVar2 + uVar22) - (uint)*(byte *)(lVar25 + uVar22)) * 2;
            iVar10 = iVar16 - iVar18;
            iVar6 = -iVar10;
            if (0 < iVar10) {
              iVar6 = iVar10;
            }
            iVar10 = -iVar7;
            if (0 < iVar7) {
              iVar10 = iVar7;
            }
            iVar9 = -1;
            iVar16 = iVar16 - iVar18;
            (&pPVar5[lVar8 + uVar22].is_dx_zero)[uVar23] = iVar16 == 0;
            *(short *)((long)&pPVar5[lVar8 + uVar22].abs_dx_abs_dy_sum + uVar23) =
                 (short)iVar10 + (short)iVar6;
            if (iVar16 != 0) {
              iVar16 = (iVar7 * 0x10000) / iVar16;
              if (iVar16 < -0x11a6e) {
                uVar17 = 7;
                uVar19 = 0;
              }
              else if (iVar16 < -0xc79) {
                uVar17 = 0xf;
                uVar19 = 8;
              }
              else {
                uVar19 = (uint)(0xe821 < iVar16) * 8 + 0x10;
                uVar17 = (uint)(0xe821 < iVar16) * 8 + 0x17;
              }
              iVar9 = '\x1f';
              if (uVar19 <= uVar17) {
                uVar21 = (ulong)uVar19;
                piVar28 = &get_hist_bin_idx_thresholds + uVar21;
                do {
                  if (iVar16 <= *piVar28) {
                    iVar9 = (int8_t)uVar21;
                    break;
                  }
                  uVar21 = uVar21 + 1;
                  piVar28 = piVar28 + 1;
                } while (uVar17 + 1 != uVar21);
              }
            }
            (&pPVar5[lVar8 + uVar22].hist_bin_idx)[uVar23] = iVar9;
            uVar22 = uVar22 + 1;
          } while (uVar22 != uVar15 - 1);
        }
        local_50 = local_50 + 1;
        lVar25 = lVar1;
      } while (local_50 != uVar14 - 1);
    }
  }
  else if (2 < uVar14) {
    uVar15 = (uint)(block_size_wide[uVar22] >> ((byte)(x->e_mbd).plane[uVar23].subsampling_x & 0x1f)
                   );
    iVar7 = -iVar7;
    local_50 = 1;
    lVar25 = *plVar11 * 2;
    do {
      lVar1 = lVar25 + lVar24 * 2;
      if (2 < uVar15) {
        lVar8 = local_50 * uVar15;
        lVar2 = lVar1 + lVar24 * 2;
        uVar23 = (ulong)uVar26;
        uVar22 = 1;
        do {
          puVar4 = (ushort *)(lVar25 + lVar24 * 2 + -2 + uVar22 * 2);
          puVar13 = (ushort *)(lVar1 + uVar22 * 2 + 2);
          iVar10 = (uint)puVar13[lVar24] + (uint)puVar13[iVar7] + (uint)*puVar13 * 2;
          iVar20 = (uint)puVar4[lVar24] + (uint)puVar4[iVar7] + (uint)*puVar4 * 2;
          iVar6 = (((uint)*(ushort *)(lVar2 + 2 + uVar22 * 2) +
                   (uint)*(ushort *)(lVar2 + -2 + uVar22 * 2)) -
                  ((uint)*(ushort *)(lVar25 + 2 + uVar22 * 2) +
                  (uint)*(ushort *)(lVar25 + -2 + uVar22 * 2))) +
                  ((uint)*(ushort *)(lVar2 + uVar22 * 2) - (uint)*(ushort *)(lVar25 + uVar22 * 2)) *
                  2;
          iVar18 = iVar10 - iVar20;
          iVar16 = -iVar18;
          if (0 < iVar18) {
            iVar16 = iVar18;
          }
          iVar18 = -iVar6;
          if (0 < iVar6) {
            iVar18 = iVar6;
          }
          iVar9 = -1;
          iVar10 = iVar10 - iVar20;
          (&pPVar5[lVar8 + uVar22].is_dx_zero)[uVar23] = iVar10 == 0;
          *(short *)((long)&pPVar5[lVar8 + uVar22].abs_dx_abs_dy_sum + uVar23) =
               (short)iVar18 + (short)iVar16;
          if (iVar10 != 0) {
            iVar10 = (iVar6 * 0x10000) / iVar10;
            if (iVar10 < -0x11a6e) {
              uVar17 = 7;
              uVar19 = 0;
            }
            else if (iVar10 < -0xc79) {
              uVar17 = 0xf;
              uVar19 = 8;
            }
            else {
              uVar19 = (uint)(0xe821 < iVar10) * 8 + 0x10;
              uVar17 = (uint)(0xe821 < iVar10) * 8 + 0x17;
            }
            iVar9 = '\x1f';
            if (uVar19 <= uVar17) {
              uVar21 = (ulong)uVar19;
              piVar28 = &get_hist_bin_idx_thresholds + uVar21;
              do {
                if (iVar10 <= *piVar28) {
                  iVar9 = (int8_t)uVar21;
                  break;
                }
                uVar21 = uVar21 + 1;
                piVar28 = piVar28 + 1;
              } while (uVar17 + 1 != uVar21);
            }
          }
          (&pPVar5[lVar8 + uVar22].hist_bin_idx)[uVar23] = iVar9;
          uVar22 = uVar22 + 1;
        } while (uVar22 != uVar15 - 1);
      }
      local_50 = local_50 + 1;
      lVar25 = lVar1;
    } while (local_50 != uVar14 - 1);
  }
  return;
}

Assistant:

static inline void compute_gradient_info_sb(MACROBLOCK *const x,
                                            BLOCK_SIZE sb_size,
                                            PLANE_TYPE plane) {
#if CONFIG_AV1_HIGHBITDEPTH
  if (is_cur_buf_hbd(&x->e_mbd)) {
    highbd_compute_gradient_info_sb(x, sb_size, plane);
    return;
  }
#endif  // CONFIG_AV1_HIGHBITDEPTH
  lowbd_compute_gradient_info_sb(x, sb_size, plane);
}